

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::createPredList(Graph *this)

{
  uint uVar1;
  int j;
  ulong uVar2;
  ulong uVar3;
  int (*paiVar4) [50];
  vector<int,_std::allocator<int>_> *this_00;
  int local_44;
  vector<int,_std::allocator<int>_> *local_40;
  ulong local_38;
  
  uVar1 = this->num_of_vert;
  clearPredList(this);
  paiVar4 = this->adj_matrix;
  local_40 = this->pred_list;
  uVar3 = 0;
  local_38 = 0;
  if (0 < (int)uVar1) {
    local_38 = (ulong)uVar1;
  }
  while (uVar3 != local_38) {
    uVar3 = uVar3 + 1;
    this_00 = local_40;
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      if (0 < (*paiVar4)[uVar2]) {
        local_44 = (int)uVar3;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_44);
      }
      this_00 = this_00 + 1;
    }
    paiVar4 = paiVar4 + 1;
  }
  return;
}

Assistant:

void Graph::createPredList(){
   int nv = this->num_of_vert;
   this->clearPredList();
   for(int i = 0; i < nv; i++)
      for(int j = 0; j < nv; j++){
         if(this->adj_matrix[i][j] >= 1)
            // pushes index of current column + 1 (current vertex)
            this->pred_list[j].push_back(i + 1);
      }
   return void();
}